

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Cluster::GetFirstTime(Cluster *this)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  longlong lVar3;
  BlockEntry *pEntry;
  BlockEntry *local_10;
  
  lVar2 = GetFirst(this,&local_10);
  if (lVar2 < 0) {
    return lVar2;
  }
  if (local_10 != (BlockEntry *)0x0) {
    iVar1 = (*local_10->_vptr_BlockEntry[2])();
    if ((Block *)CONCAT44(extraout_var,iVar1) != (Block *)0x0) {
      lVar3 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar1),this);
      return lVar3;
    }
    __assert_fail("pBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1bde,"long long mkvparser::Cluster::GetFirstTime() const");
  }
  lVar3 = GetTime(this);
  return lVar3;
}

Assistant:

long long Cluster::GetFirstTime() const {
  const BlockEntry* pEntry;

  const long status = GetFirst(pEntry);

  if (status < 0)  // error
    return status;

  if (pEntry == NULL)  // empty cluster
    return GetTime();

  const Block* const pBlock = pEntry->GetBlock();
  assert(pBlock);

  return pBlock->GetTime(this);
}